

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O0

StringRef getHWDivSynonym(StringRef HWDiv)

{
  StringRef SVar1;
  bool bVar2;
  StringRef *pSVar3;
  StringLiteral local_170;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  Optional<llvm::StringRef> OStack_140;
  char *local_128;
  StringRef HWDiv_local;
  StringRef local_b8;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char **local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  int local_34;
  char **local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  
  local_158 = (char *)HWDiv.Length;
  local_160 = HWDiv.Data;
  local_128 = local_160;
  HWDiv_local.Data = local_158;
  local_150 = local_160;
  local_148 = local_158;
  llvm::Optional<llvm::StringRef>::Optional(&OStack_140);
  llvm::StringLiteral::StringLiteral<10UL>(&local_170,(char (*) [10])"thumb,arm");
  local_b8.Length = strlen("arm,thumb");
  local_a8 = local_170.super_StringRef.Data;
  local_a0 = (char *)local_170.super_StringRef.Length;
  local_b8.Data = "arm,thumb";
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_140);
  if (!bVar2) {
    local_78 = local_150;
    local_70 = local_148;
    local_88 = local_a8;
    local_80 = local_a0;
    local_98 = local_a8;
    local_90 = local_a0;
    local_60 = local_a8;
    local_58 = local_a0;
    local_68 = &local_78;
    bVar2 = false;
    if (local_148 == local_a0) {
      local_40 = local_150;
      local_48 = local_a8;
      local_50 = local_a0;
      if (local_a0 == (char *)0x0) {
        local_34 = 0;
      }
      else {
        local_34 = memcmp(local_150,local_a8,(size_t)local_a0);
      }
      bVar2 = local_34 == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_140,&local_b8);
    }
  }
  local_28 = local_128;
  local_20 = HWDiv_local.Data;
  local_30 = &local_150;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_140);
  if (bVar2) {
    pSVar3 = llvm::Optional<llvm::StringRef>::operator*(&OStack_140);
    local_18 = pSVar3->Data;
    local_10 = (char *)pSVar3->Length;
  }
  else {
    local_18 = local_28;
    local_10 = local_20;
  }
  SVar1.Length = (size_t)local_10;
  SVar1.Data = local_18;
  return SVar1;
}

Assistant:

static StringRef getHWDivSynonym(StringRef HWDiv) {
  return StringSwitch<StringRef>(HWDiv)
      .Case("thumb,arm", "arm,thumb")
      .Default(HWDiv);
}